

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O0

FT_Error T1_Face_Init(FT_Stream stream,FT_Face t1face,FT_Int face_index,FT_Int num_params,
                     FT_Parameter *params)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  FT_Fixed FVar5;
  FT_CMap_Class local_b8;
  FT_CMap_Class clazz;
  T1_CMap_Classes cmap_classes;
  FT_CharMapRec charmap;
  FT_Face root_1;
  FT_Pos max_advance;
  char *pcStack_80;
  FT_Bool the_same;
  char *family;
  char *full;
  FT_Face root;
  FT_Pointer _tmp_;
  FT_Module module;
  PS_FontInfo info;
  T1_Font type1;
  PSAux_Service psaux;
  FT_Service_PsCMaps psnames;
  T1_Face pTStack_30;
  FT_Error error;
  T1_Face face;
  FT_Parameter *params_local;
  FT_Int num_params_local;
  FT_Int face_index_local;
  FT_Face t1face_local;
  FT_Stream stream_local;
  
  module = (FT_Module)(t1face + 1);
  t1face->num_faces = 1;
  _tmp_ = t1face->driver;
  info = (PS_FontInfo)module;
  pTStack_30 = (T1_Face)t1face;
  face = (T1_Face)params;
  params_local._0_4_ = num_params;
  params_local._4_4_ = face_index;
  _num_params_local = t1face;
  t1face_local = (FT_Face)stream;
  root = (FT_Face)ft_module_get_service((FT_Module)_tmp_,"postscript-cmaps",'\x01');
  pTStack_30->psnames = root;
  psaux = (PSAux_Service)root;
  pvVar4 = FT_Get_Module_Interface((((pTStack_30->root).driver)->root).library,"psaux");
  pTStack_30->psaux = pvVar4;
  type1 = (T1_Font)pTStack_30->psaux;
  if (type1 == (T1_Font)0x0) {
    psnames._4_4_ = 0xb;
  }
  else {
    pvVar4 = FT_Get_Module_Interface((((pTStack_30->root).driver)->root).library,"pshinter");
    pTStack_30->pshinter = pvVar4;
    psnames._4_4_ = T1_Open_Face(pTStack_30);
    if ((psnames._4_4_ == 0) && (-1 < (int)params_local._4_4_)) {
      if ((params_local._4_4_ & 0xffff) == 0) {
        full = (char *)pTStack_30;
        (pTStack_30->root).num_glyphs = (long)*(int *)&info[7].version;
        (pTStack_30->root).face_index = 0;
        (pTStack_30->root).face_flags = (pTStack_30->root).face_flags | 0xa11;
        if (*(char *)&module[2].clazz != '\0') {
          (pTStack_30->root).face_flags = (pTStack_30->root).face_flags | 4;
        }
        if (pTStack_30->blend != (PS_Blend)0x0) {
          (pTStack_30->root).face_flags = (pTStack_30->root).face_flags | 0x100;
        }
        (pTStack_30->root).family_name = (FT_String *)module[1].clazz;
        (pTStack_30->root).style_name = (FT_String *)0x0;
        if ((pTStack_30->root).family_name == (FT_String *)0x0) {
          if (info[5].notice != (FT_String *)0x0) {
            (pTStack_30->root).family_name = info[5].notice;
          }
        }
        else {
          family = (char *)module->memory;
          pcStack_80 = (pTStack_30->root).family_name;
          if ((FT_Memory)family != (FT_Memory)0x0) {
            max_advance._7_1_ = '\x01';
            while (*family != '\0') {
              if (*family == *pcStack_80) {
                pcStack_80 = pcStack_80 + 1;
                family = family + 1;
              }
              else if ((*family == ' ') || (*family == '-')) {
                family = family + 1;
              }
              else {
                if ((*pcStack_80 != ' ') && (*pcStack_80 != '-')) {
                  max_advance._7_1_ = '\0';
                  if (*pcStack_80 == '\0') {
                    (pTStack_30->root).style_name = family;
                  }
                  break;
                }
                pcStack_80 = pcStack_80 + 1;
              }
            }
            if (max_advance._7_1_ != '\0') {
              (pTStack_30->root).style_name = "Regular";
            }
          }
        }
        if ((pTStack_30->root).style_name == (FT_String *)0x0) {
          if (module[1].library == (FT_Library)0x0) {
            (pTStack_30->root).style_name = "Regular";
          }
          else {
            (pTStack_30->root).style_name = (FT_String *)module[1].library;
          }
        }
        (pTStack_30->root).style_flags = 0;
        if (module[1].memory != (FT_Memory)0x0) {
          (pTStack_30->root).style_flags = (pTStack_30->root).style_flags | 1;
        }
        if ((module[1].library != (FT_Library)0x0) &&
           ((iVar2 = strcmp((char *)module[1].library,"Bold"), iVar2 == 0 ||
            (iVar2 = strcmp((char *)module[1].library,"Black"), iVar2 == 0)))) {
          *(ulong *)(full + 0x18) = *(ulong *)(full + 0x18) | 2;
        }
        full[0x38] = '\0';
        full[0x39] = '\0';
        full[0x3a] = '\0';
        full[0x3b] = '\0';
        full[0x40] = '\0';
        full[0x41] = '\0';
        full[0x42] = '\0';
        full[0x43] = '\0';
        full[0x44] = '\0';
        full[0x45] = '\0';
        full[0x46] = '\0';
        full[0x47] = '\0';
        *(long *)(full + 0x68) = (long)info[8].weight >> 0x10;
        *(FT_Long *)(full + 0x70) = info[8].italic_angle >> 0x10;
        *(long *)(full + 0x78) = *(long *)&info[8].is_fixed_pitch + 0xffff >> 0x10;
        *(long *)(full + 0x80) = (long)(info[9].version + 0xffff) >> 0x10;
        if (*(short *)(full + 0x88) == 0) {
          full[0x88] = -0x18;
          full[0x89] = '\x03';
        }
        *(short *)(full + 0x8a) = (short)*(undefined8 *)(full + 0x80);
        *(short *)(full + 0x8c) = (short)*(undefined8 *)(full + 0x70);
        *(short *)(full + 0x8e) = (short)((ulong)((uint)*(ushort *)(full + 0x88) * 0xc) / 10);
        if ((int)*(short *)(full + 0x8e) <
            (int)*(short *)(full + 0x8a) - (int)*(short *)(full + 0x8c)) {
          *(short *)(full + 0x8e) = *(short *)(full + 0x8a) - *(short *)(full + 0x8c);
        }
        *(short *)(full + 0x90) = (short)*(undefined8 *)(full + 0x78);
        psnames._4_4_ = T1_Compute_Max_Advance(pTStack_30,(FT_Pos *)&root_1);
        if (psnames._4_4_ == 0) {
          FVar5 = FT_RoundFix((FT_Fixed)root_1);
          *(short *)(full + 0x90) = (short)((ulong)FVar5 >> 0x10);
        }
        else {
          psnames._4_4_ = 0;
        }
        *(undefined2 *)(full + 0x92) = *(undefined2 *)(full + 0x8e);
        *(undefined2 *)(full + 0x94) = *(undefined2 *)((long)&module[2].clazz + 2);
        *(undefined2 *)(full + 0x96) = *(undefined2 *)((long)&module[2].clazz + 4);
        charmap._8_8_ = pTStack_30;
        if (psaux != (PSAux_Service)0x0) {
          puVar1 = *(undefined8 **)&type1->private_dict;
          cmap_classes = (T1_CMap_Classes)pTStack_30;
          charmap.face._4_2_ = 3;
          charmap.face._6_2_ = 1;
          charmap.face._0_4_ = 0x756e6963;
          psnames._4_4_ =
               FT_CMap_New((FT_CMap_Class)puVar1[3],(FT_Pointer)0x0,(FT_CharMap)&cmap_classes,
                           (FT_CMap_conflict *)0x0);
          if ((psnames._4_4_ == 0) || ((psnames._4_4_ & 0xff) == 0xa3)) {
            psnames._4_4_ = 0;
            charmap.face._4_2_ = 7;
            local_b8 = (FT_CMap_Class)0x0;
            uVar3 = *(int *)&info[5].full_name - 1;
            if (uVar3 < 3 || *(int *)&info[5].full_name == 4) {
              switch((long)&switchD_00348e18::switchdataD_0039262c +
                     (long)(int)(&switchD_00348e18::switchdataD_0039262c)[uVar3]) {
              case 0x348e1a:
                charmap.face._0_4_ = 0x41444f42;
                charmap.face._6_2_ = 0;
                local_b8 = (FT_CMap_Class)*puVar1;
                break;
              case 0x348e40:
                charmap.face._0_4_ = 0x41444245;
                charmap.face._6_2_ = 1;
                local_b8 = (FT_CMap_Class)puVar1[1];
                break;
              case 0x348e67:
                charmap.face._0_4_ = 0x41444243;
                charmap.face._6_2_ = 2;
                local_b8 = (FT_CMap_Class)puVar1[2];
                break;
              case 0x348e8e:
                charmap.face._0_4_ = 0x6c617431;
                charmap.face._6_2_ = 3;
                local_b8 = (FT_CMap_Class)puVar1[3];
              }
            }
            if (local_b8 != (FT_CMap_Class)0x0) {
              psnames._4_4_ =
                   FT_CMap_New(local_b8,(FT_Pointer)0x0,(FT_CharMap)&cmap_classes,
                               (FT_CMap_conflict *)0x0);
            }
          }
        }
      }
      else {
        psnames._4_4_ = 6;
      }
    }
  }
  return psnames._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Face_Init( FT_Stream      stream,
                FT_Face        t1face,          /* T1_Face */
                FT_Int         face_index,
                FT_Int         num_params,
                FT_Parameter*  params )
  {
    T1_Face             face = (T1_Face)t1face;
    FT_Error            error;
    FT_Service_PsCMaps  psnames;
    PSAux_Service       psaux;
    T1_Font             type1 = &face->type1;
    PS_FontInfo         info = &type1->font_info;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    face->root.num_faces = 1;

    FT_FACE_FIND_GLOBAL_SERVICE( face, psnames, POSTSCRIPT_CMAPS );
    face->psnames = psnames;

    face->psaux = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                           "psaux" );
    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      FT_ERROR(( "T1_Face_Init: cannot access `psaux' module\n" ));
      error = FT_THROW( Missing_Module );
      goto Exit;
    }

    face->pshinter = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                              "pshinter" );

    FT_TRACE2(( "Type 1 driver\n" ));

    /* open the tokenizer; this will also check the font format */
    error = T1_Open_Face( face );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    if ( ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "T1_Face_Init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* now load the font program into the face object */

    /* initialize the face object fields */

    /* set up root face fields */
    {
      FT_Face  root = (FT_Face)&face->root;


      root->num_glyphs = type1->num_glyphs;
      root->face_index = 0;

      root->face_flags |= FT_FACE_FLAG_SCALABLE    |
                          FT_FACE_FLAG_HORIZONTAL  |
                          FT_FACE_FLAG_GLYPH_NAMES |
                          FT_FACE_FLAG_HINTER;

      if ( info->is_fixed_pitch )
        root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( face->blend )
        root->face_flags |= FT_FACE_FLAG_MULTIPLE_MASTERS;

      /* The following code to extract the family and the style is very   */
      /* simplistic and might get some things wrong.  For a full-featured */
      /* algorithm you might have a look at the whitepaper given at       */
      /*                                                                  */
      /*   https://blogs.msdn.com/text/archive/2007/04/23/wpf-font-selection-model.aspx */

      /* get style name -- be careful, some broken fonts only */
      /* have a `/FontName' dictionary entry!                 */
      root->family_name = info->family_name;
      root->style_name  = NULL;

      if ( root->family_name )
      {
        char*  full   = info->full_name;
        char*  family = root->family_name;


        if ( full )
        {
          FT_Bool  the_same = TRUE;


          while ( *full )
          {
            if ( *full == *family )
            {
              family++;
              full++;
            }
            else
            {
              if ( *full == ' ' || *full == '-' )
                full++;
              else if ( *family == ' ' || *family == '-' )
                family++;
              else
              {
                the_same = FALSE;

                if ( !*family )
                  root->style_name = full;
                break;
              }
            }
          }

          if ( the_same )
            root->style_name = (char *)"Regular";
        }
      }
      else
      {
        /* do we have a `/FontName'? */
        if ( type1->font_name )
          root->family_name = type1->font_name;
      }

      if ( !root->style_name )
      {
        if ( info->weight )
          root->style_name = info->weight;
        else
          /* assume `Regular' style because we don't know better */
          root->style_name = (char *)"Regular";
      }

      /* compute style flags */
      root->style_flags = 0;
      if ( info->italic_angle )
        root->style_flags |= FT_STYLE_FLAG_ITALIC;
      if ( info->weight )
      {
        if ( !ft_strcmp( info->weight, "Bold"  ) ||
             !ft_strcmp( info->weight, "Black" ) )
          root->style_flags |= FT_STYLE_FLAG_BOLD;
      }

      /* no embedded bitmap support */
      root->num_fixed_sizes = 0;
      root->available_sizes = NULL;

      root->bbox.xMin =   type1->font_bbox.xMin            >> 16;
      root->bbox.yMin =   type1->font_bbox.yMin            >> 16;
      /* no `U' suffix here to 0xFFFF! */
      root->bbox.xMax = ( type1->font_bbox.xMax + 0xFFFF ) >> 16;
      root->bbox.yMax = ( type1->font_bbox.yMax + 0xFFFF ) >> 16;

      /* Set units_per_EM if we didn't set it in t1_parse_font_matrix. */
      if ( !root->units_per_EM )
        root->units_per_EM = 1000;

      root->ascender  = (FT_Short)( root->bbox.yMax );
      root->descender = (FT_Short)( root->bbox.yMin );

      root->height = (FT_Short)( ( root->units_per_EM * 12 ) / 10 );
      if ( root->height < root->ascender - root->descender )
        root->height = (FT_Short)( root->ascender - root->descender );

      /* now compute the maximum advance width */
      root->max_advance_width =
        (FT_Short)( root->bbox.xMax );
      {
        FT_Pos  max_advance;


        error = T1_Compute_Max_Advance( face, &max_advance );

        /* in case of error, keep the standard width */
        if ( !error )
          root->max_advance_width = (FT_Short)FIXED_TO_INT( max_advance );
        else
          error = FT_Err_Ok;   /* clear error */
      }

      root->max_advance_height = root->height;

      root->underline_position  = (FT_Short)info->underline_position;
      root->underline_thickness = (FT_Short)info->underline_thickness;
    }

    {
      FT_Face  root = &face->root;


      if ( psnames )
      {
        FT_CharMapRec    charmap;
        T1_CMap_Classes  cmap_classes = psaux->t1_cmap_classes;
        FT_CMap_Class    clazz;


        charmap.face = root;

        /* first of all, try to synthesize a Unicode charmap */
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( cmap_classes->unicode, NULL, &charmap, NULL );
        if ( error                                      &&
             FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
          goto Exit;
        error = FT_Err_Ok;

        /* now, generate an Adobe Standard encoding when appropriate */
        charmap.platform_id = TT_PLATFORM_ADOBE;
        clazz               = NULL;

        switch ( type1->encoding_type )
        {
        case T1_ENCODING_TYPE_STANDARD:
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;
          clazz               = cmap_classes->standard;
          break;

        case T1_ENCODING_TYPE_EXPERT:
          charmap.encoding    = FT_ENCODING_ADOBE_EXPERT;
          charmap.encoding_id = TT_ADOBE_ID_EXPERT;
          clazz               = cmap_classes->expert;
          break;

        case T1_ENCODING_TYPE_ARRAY:
          charmap.encoding    = FT_ENCODING_ADOBE_CUSTOM;
          charmap.encoding_id = TT_ADOBE_ID_CUSTOM;
          clazz               = cmap_classes->custom;
          break;

        case T1_ENCODING_TYPE_ISOLATIN1:
          charmap.encoding    = FT_ENCODING_ADOBE_LATIN_1;
          charmap.encoding_id = TT_ADOBE_ID_LATIN_1;
          clazz               = cmap_classes->unicode;
          break;

        default:
          ;
        }

        if ( clazz )
          error = FT_CMap_New( clazz, NULL, &charmap, NULL );
      }
    }

  Exit:
    return error;
  }